

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

MemoryPoolAllocator<rapidjson::CrtAllocator> * __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GetAllocator(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               *this)

{
  RapidJSONException *this_00;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_local;
  
  if (this->allocator_ == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
    this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this_00,"rapidjson internal assertion failure: allocator_");
    __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,
                cereal::RapidJSONException::~RapidJSONException);
  }
  return this->allocator_;
}

Assistant:

Allocator& GetAllocator() {
        CEREAL_RAPIDJSON_ASSERT(allocator_);
        return *allocator_;
    }